

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O3

int quicly_encrypt_address_token
              (_func_void_void_ptr_size_t *random_bytes,ptls_aead_context_t *aead,ptls_buffer_t *buf
              ,size_t start_off,quicly_address_token_plaintext_t *plaintext)

{
  uint8_t *puVar1;
  sa_family_t sVar2;
  in_port_t iVar3;
  ulong uVar4;
  anon_enum_32 aVar5;
  int iVar6;
  size_t len;
  size_t sVar7;
  size_t sVar8;
  void *src;
  anon_union_264_2_c953a9df_for_st_quicly_address_token_plaintext_t_5 *src_00;
  size_t local_48;
  undefined1 local_3a;
  undefined1 local_39;
  ulong local_38;
  
  iVar6 = ptls_buffer_reserve(buf,aead->algo->iv_size + 1);
  if (iVar6 == 0) {
    aVar5 = plaintext->type;
    sVar8 = buf->off;
    buf->off = sVar8 + 1;
    buf->base[sVar8] = (char)aVar5;
    (*random_bytes)(buf->base + buf->off,aead->algo->iv_size);
    sVar8 = buf->off + aead->algo->iv_size;
    buf->off = sVar8;
    uVar4 = plaintext->issued_at;
    local_38 = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18
               | (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 |
               (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
    iVar6 = ptls_buffer__do_pushv(buf,&local_38,8);
    if ((iVar6 == 0) && (iVar6 = ptls_buffer__do_pushv(buf,"",1), iVar6 == 0)) {
      sVar7 = buf->off;
      sVar2 = (plaintext->remote).sa.sa_family;
      if (sVar2 == 10) {
        src = (void *)((long)&plaintext->remote + 8);
        len = 0x10;
      }
      else {
        if (sVar2 != 2) {
          __assert_fail("!\"unspported address type\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                        ,0x17d4,
                        "int quicly_encrypt_address_token(void (*)(void *, size_t), ptls_aead_context_t *, ptls_buffer_t *, size_t, const quicly_address_token_plaintext_t *)"
                       );
        }
        src = (void *)((long)&plaintext->remote + 4);
        len = 4;
      }
      iVar6 = ptls_buffer__do_pushv(buf,src,len);
      if (iVar6 == 0) {
        iVar3 = (plaintext->remote).sin.sin_port;
        buf->base[sVar7 - 1] = (char)(int)buf->off - (char)sVar7;
        local_3a = (undefined1)iVar3;
        local_39 = (undefined1)(iVar3 >> 8);
        iVar6 = ptls_buffer__do_pushv(buf,&local_3a,2);
        if (iVar6 == 0) {
          if (plaintext->type == QUICLY_ADDRESS_TOKEN_TYPE_RESUMPTION) {
            iVar6 = ptls_buffer__do_pushv(buf,"",1);
            if (iVar6 != 0) {
              return iVar6;
            }
            local_48 = buf->off;
            src_00 = &plaintext->field_4;
            sVar7 = (plaintext->field_4).resumption.len;
          }
          else {
            if (plaintext->type != QUICLY_ADDRESS_TOKEN_TYPE_RETRY) {
              __assert_fail("!\"unexpected token type\"",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/../lib/quicly.c"
                            ,0x17e7,
                            "int quicly_encrypt_address_token(void (*)(void *, size_t), ptls_aead_context_t *, ptls_buffer_t *, size_t, const quicly_address_token_plaintext_t *)"
                           );
            }
            iVar6 = ptls_buffer__do_pushv(buf,"",1);
            if (iVar6 != 0) {
              return iVar6;
            }
            sVar7 = buf->off;
            iVar6 = ptls_buffer__do_pushv
                              (buf,&plaintext->field_4,
                               (ulong)(plaintext->field_4).retry.original_dcid.len);
            if (iVar6 != 0) {
              return iVar6;
            }
            buf->base[sVar7 - 1] = (char)(int)buf->off - (char)sVar7;
            iVar6 = ptls_buffer__do_pushv(buf,"",1);
            if (iVar6 != 0) {
              return iVar6;
            }
            sVar7 = buf->off;
            iVar6 = ptls_buffer__do_pushv
                              (buf,(void *)((long)&plaintext->field_4 + 0x15),
                               (ulong)(plaintext->field_4).retry.client_cid.len);
            if (iVar6 != 0) {
              return iVar6;
            }
            buf->base[sVar7 - 1] = (char)(int)buf->off - (char)sVar7;
            iVar6 = ptls_buffer__do_pushv(buf,"",1);
            if (iVar6 != 0) {
              return iVar6;
            }
            local_48 = buf->off;
            src_00 = (anon_union_264_2_c953a9df_for_st_quicly_address_token_plaintext_t_5 *)
                     ((long)&plaintext->field_4 + 0x2a);
            sVar7 = (size_t)(plaintext->field_4).retry.server_cid.len;
          }
          iVar6 = ptls_buffer__do_pushv(buf,src_00,sVar7);
          if (iVar6 == 0) {
            buf->base[local_48 - 1] = (char)(int)buf->off - (char)local_48;
            iVar6 = ptls_buffer__do_pushv(buf,"",1);
            if (iVar6 == 0) {
              sVar7 = buf->off;
              iVar6 = ptls_buffer__do_pushv(buf,&plaintext->appdata,(plaintext->appdata).len);
              if (iVar6 == 0) {
                buf->base[sVar7 - 1] = (char)(int)buf->off - (char)sVar7;
                iVar6 = ptls_buffer_reserve(buf,aead->algo->tag_size);
                if (iVar6 == 0) {
                  iVar6 = 0;
                  (*aead->algo->setup_crypto)
                            (aead,1,(void *)0x0,buf->base + (sVar8 - aead->algo->iv_size));
                  puVar1 = buf->base + sVar8;
                  (*aead->do_encrypt)(aead,puVar1,puVar1,buf->off - sVar8,0,buf->base + start_off,
                                      sVar8 - start_off,(ptls_aead_supplementary_encryption_t *)0x0)
                  ;
                  buf->off = buf->off + aead->algo->tag_size;
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int quicly_encrypt_address_token(void (*random_bytes)(void *, size_t), ptls_aead_context_t *aead, ptls_buffer_t *buf,
                                 size_t start_off, const quicly_address_token_plaintext_t *plaintext)
{
    int ret;

    /* type and IV */
    if ((ret = ptls_buffer_reserve(buf, 1 + aead->algo->iv_size)) != 0)
        goto Exit;
    buf->base[buf->off++] = plaintext->type;
    random_bytes(buf->base + buf->off, aead->algo->iv_size);
    buf->off += aead->algo->iv_size;

    size_t enc_start = buf->off;

    /* data */
    ptls_buffer_push64(buf, plaintext->issued_at);
    {
        uint16_t port;
        ptls_buffer_push_block(buf, 1, {
            switch (plaintext->remote.sa.sa_family) {
            case AF_INET:
                ptls_buffer_pushv(buf, &plaintext->remote.sin.sin_addr.s_addr, 4);
                port = ntohs(plaintext->remote.sin.sin_port);
                break;
            case AF_INET6:
                ptls_buffer_pushv(buf, &plaintext->remote.sin6.sin6_addr, 16);
                port = ntohs(plaintext->remote.sin6.sin6_port);
                break;
            default:
                assert(!"unspported address type");
                break;
            }
        });
        ptls_buffer_push16(buf, port);
    }
    switch (plaintext->type) {
    case QUICLY_ADDRESS_TOKEN_TYPE_RETRY:
        ptls_buffer_push_block(buf, 1,
                               { ptls_buffer_pushv(buf, plaintext->retry.original_dcid.cid, plaintext->retry.original_dcid.len); });
        ptls_buffer_push_block(buf, 1,
                               { ptls_buffer_pushv(buf, plaintext->retry.client_cid.cid, plaintext->retry.client_cid.len); });
        ptls_buffer_push_block(buf, 1,
                               { ptls_buffer_pushv(buf, plaintext->retry.server_cid.cid, plaintext->retry.server_cid.len); });
        break;
    case QUICLY_ADDRESS_TOKEN_TYPE_RESUMPTION:
        ptls_buffer_push_block(buf, 1, { ptls_buffer_pushv(buf, plaintext->resumption.bytes, plaintext->resumption.len); });
        break;
    default:
        assert(!"unexpected token type");
        abort();
    }
    ptls_buffer_push_block(buf, 1, { ptls_buffer_pushv(buf, plaintext->appdata.bytes, plaintext->appdata.len); });

    /* encrypt, abusing the internal API to supply full IV */
    if ((ret = ptls_buffer_reserve(buf, aead->algo->tag_size)) != 0)
        goto Exit;
    aead->algo->setup_crypto(aead, 1, NULL, buf->base + enc_start - aead->algo->iv_size);
    ptls_aead_encrypt(aead, buf->base + enc_start, buf->base + enc_start, buf->off - enc_start, 0, buf->base + start_off,
                      enc_start - start_off);
    buf->off += aead->algo->tag_size;

Exit:
    return ret;
}